

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_ptr.hpp
# Opt level: O2

exception_ptr
boost::exception_detail::get_static_exception_object<boost::exception_detail::bad_exception_>(void)

{
  atomic_int_least32_t *paVar1;
  shared_count sVar2;
  int iVar3;
  clone_impl<boost::exception_detail::bad_exception_> *this;
  shared_count extraout_RDX;
  element_type *in_RDI;
  exception_ptr eVar4;
  element_type *local_88;
  shared_count local_80;
  clone_impl<boost::exception_detail::bad_exception_> c;
  bad_exception_ ba;
  
  ba.super_exception.throw_file_ = (char *)0x0;
  ba.super_exception.data_.px_ = (error_info_container *)0x0;
  ba.super_exception.throw_function_ = (char *)0x0;
  ba.super_exception.throw_line_ = -1;
  ba.super_exception._vptr_exception = (_func_int **)&PTR__bad_exception__001e25b8;
  ba._40_8_ = &PTR__bad_exception__001e25d8;
  clone_impl<boost::exception_detail::bad_exception_>::clone_impl(&c,&ba);
  c.super_bad_exception_.super_exception.throw_function_ =
       "exception_ptr boost::exception_detail::get_static_exception_object() [Exception = boost::exception_detail::bad_exception_]"
  ;
  c.super_bad_exception_.super_exception.throw_file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/exception/detail/exception_ptr.hpp"
  ;
  c.super_bad_exception_.super_exception.throw_line_ = 0x81;
  if (get_static_exception_object<boost::exception_detail::bad_exception_>()::ep == '\0') {
    iVar3 = __cxa_guard_acquire(&get_static_exception_object<boost::exception_detail::bad_exception_>()
                                 ::ep);
    if (iVar3 != 0) {
      this = (clone_impl<boost::exception_detail::bad_exception_> *)operator_new(0x38);
      clone_impl<boost::exception_detail::bad_exception_>::clone_impl(this,&c);
      shared_ptr<boost::exception_detail::clone_base_const>::
      shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>>
                ((shared_ptr<boost::exception_detail::clone_base_const> *)&local_88,this);
      get_static_exception_object<boost::exception_detail::bad_exception_>::ep.ptr_.px = local_88;
      get_static_exception_object<boost::exception_detail::bad_exception_>::ep.ptr_.pn.pi_ =
           local_80.pi_;
      if (local_80.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_80.pi_)->use_count_ = (local_80.pi_)->use_count_ + 1;
        UNLOCK();
      }
      detail::shared_count::~shared_count(&local_80);
      __cxa_atexit(exception_ptr::~exception_ptr,
                   &get_static_exception_object<boost::exception_detail::bad_exception_>::ep,
                   &__dso_handle);
      __cxa_guard_release(&get_static_exception_object<boost::exception_detail::bad_exception_>()::
                           ep);
    }
  }
  in_RDI->_vptr_clone_base =
       (_func_int **)
       get_static_exception_object<boost::exception_detail::bad_exception_>::ep.ptr_.px;
  sVar2 = get_static_exception_object<boost::exception_detail::bad_exception_>::ep.ptr_.pn;
  in_RDI[1]._vptr_clone_base =
       (_func_int **)
       get_static_exception_object<boost::exception_detail::bad_exception_>::ep.ptr_.pn.pi_;
  if (sVar2.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    paVar1 = &(sVar2.pi_)->use_count_;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
  }
  bad_exception_::~bad_exception_(&c.super_bad_exception_);
  bad_exception_::~bad_exception_(&ba);
  eVar4.ptr_.pn.pi_ = extraout_RDX.pi_;
  eVar4.ptr_.px = in_RDI;
  return (exception_ptr)eVar4.ptr_;
}

Assistant:

exception_ptr
        get_static_exception_object()
            {
            Exception ba;
            exception_detail::clone_impl<Exception> c(ba);
#ifndef BOOST_EXCEPTION_DISABLE
            c <<
                throw_function(BOOST_CURRENT_FUNCTION) <<
                throw_file(__FILE__) <<
                throw_line(__LINE__);
#endif
            static exception_ptr ep(shared_ptr<exception_detail::clone_base const>(new exception_detail::clone_impl<Exception>(c)));
            return ep;
            }